

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O2

void __thiscall
ddd::DictionarySGL<true,_false>::DictionarySGL(DictionarySGL<true,_false> *this,istream *is)

{
  __uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  __p;
  tuple<ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  in_RAX;
  __uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  local_28;
  
  (this->super_Dictionary)._vptr_Dictionary = (_func_int **)&PTR__DictionarySGL_0013a858;
  (this->trie_)._M_t.
  super___uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl =
       (DaTrie<true,_false,_false> *)0x0;
  this->num_keys_ = 0;
  local_28._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl =
       (tuple<ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
        )(tuple<ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
          )in_RAX.
           super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl;
  make_unique<ddd::DaTrie<true,false,false>,std::istream&>((ddd *)&local_28,is);
  __p._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl =
       local_28._M_t.
       super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
       .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl;
  local_28._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl =
       (tuple<ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
        )(_Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  ::reset((__uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
           *)&this->trie_,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                   .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl);
  std::
  unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  ::~unique_ptr((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                 *)&local_28);
  utils::read_value<unsigned_long>(&this->num_keys_,is);
  return;
}

Assistant:

DictionarySGL(std::istream& is) {
    trie_ = make_unique<TrieType>(is);
    utils::read_value(num_keys_, is);
  }